

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementUtilities.cpp
# Opt level: O0

int __thiscall
Rml::ElementUtilities::GetStringWidth
          (ElementUtilities *this,Element *element,StringView string,Character prior_character)

{
  FontFaceHandle FVar1;
  FontEngineInterface *pFVar2;
  FontFaceHandle font_face_handle;
  TextShapingContext text_shaping_context;
  ComputedValues *computed;
  Character prior_character_local;
  Element *element_local;
  StringView string_local;
  
  text_shaping_context._8_8_ = Element::GetComputedValues((Element *)this);
  font_face_handle =
       (FontFaceHandle)
       Style::ComputedValues::language_abi_cxx11_((ComputedValues *)text_shaping_context._8_8_);
  text_shaping_context.language._0_1_ =
       Style::ComputedValues::direction((ComputedValues *)text_shaping_context._8_8_);
  text_shaping_context.language._4_4_ =
       Style::ComputedValues::letter_spacing((ComputedValues *)text_shaping_context._8_8_);
  FVar1 = Element::GetFontFaceHandle((Element *)this);
  if (FVar1 == 0) {
    string_local.p_end._4_4_ = 0;
  }
  else {
    pFVar2 = GetFontEngineInterface();
    string_local.p_end._4_4_ =
         (*pFVar2->_vptr_FontEngineInterface[9])
                   (pFVar2,FVar1,element,string.p_begin,&font_face_handle,(ulong)(uint)string.p_end)
    ;
  }
  return string_local.p_end._4_4_;
}

Assistant:

int ElementUtilities::GetStringWidth(Element* element, StringView string, Character prior_character)
{
	const auto& computed = element->GetComputedValues();
	const TextShapingContext text_shaping_context{computed.language(), computed.direction(), computed.letter_spacing()};

	FontFaceHandle font_face_handle = element->GetFontFaceHandle();
	if (font_face_handle == 0)
		return 0;

	return GetFontEngineInterface()->GetStringWidth(font_face_handle, string, text_shaping_context, prior_character);
}